

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_general_print(emitter_t *emitter)

{
  tsd_t *ptVar1;
  long lVar2;
  emitter_t *peVar3;
  int iVar4;
  emitter_output_t eVar5;
  int iVar6;
  tsd_t *ptVar7;
  ulong uVar8;
  size_t *value;
  char *pcVar9;
  long *in_FS_OFFSET;
  _Bool bv;
  size_t sv;
  uint uv;
  char *cpv;
  size_t bsz;
  _Bool bv2;
  size_t ssz;
  size_t cpsz;
  size_t miblen_new;
  ssize_t ssv;
  size_t sz_20;
  size_t sssz;
  size_t usz;
  emitter_t *local_c8;
  uint nlextents;
  uint arenas_nbins;
  uint32_t u32v;
  int64_t i64v;
  size_t sz;
  ulong local_98;
  uint64_t u64v;
  uint arenas_nhbins;
  size_t i64sz;
  size_t u64sz;
  ssize_t ssv2;
  ulong local_40;
  size_t u32sz;
  
  bsz = 1;
  usz = 4;
  ssz = 8;
  sssz = 8;
  cpsz = 8;
  u32sz = 4;
  i64sz = 8;
  u64sz = 8;
  sz = 8;
  iVar4 = duckdb_je_mallctl("version",&cpv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "version";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"version","Version",emitter_type_string,&cpv,(char *)0x0,emitter_type_bool
                  ,(void *)0x0);
  emitter_dict_begin(emitter,"config","Build-time option settings");
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.cache_oblivious",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.cache_oblivious";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"cache_oblivious","config.cache_oblivious",emitter_type_bool,&bv,
                  (char *)0x0,emitter_type_bool,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.debug",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.debug";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"debug","config.debug",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool
                  ,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.fill",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.fill";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"fill","config.fill",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                  (void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.lazy_lock",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.lazy_lock";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"lazy_lock","config.lazy_lock",emitter_type_bool,&bv,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  emitter_kv_note(emitter,"malloc_conf","config.malloc_conf",emitter_type_string,&config_malloc_conf
                  ,(char *)0x0,emitter_type_bool,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.opt_safety_checks",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.opt_safety_checks";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"opt_safety_checks","config.opt_safety_checks",emitter_type_bool,&bv,
                  (char *)0x0,emitter_type_bool,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.prof",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.prof";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"prof","config.prof",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                  (void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.prof_libgcc",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.prof_libgcc";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"prof_libgcc","config.prof_libgcc",emitter_type_bool,&bv,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.prof_libunwind",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.prof_libunwind";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"prof_libunwind","config.prof_libunwind",emitter_type_bool,&bv,(char *)0x0
                  ,emitter_type_bool,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.stats",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.stats";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"stats","config.stats",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool
                  ,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.utrace",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.utrace";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"utrace","config.utrace",emitter_type_bool,&bv,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  sz = 1;
  iVar4 = duckdb_je_mallctl("config.xmalloc",&bv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "config.xmalloc";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"xmalloc","config.xmalloc",emitter_type_bool,&bv,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  eVar5 = emitter->output;
  if (eVar5 < emitter_output_table) {
    emitter->nesting_depth = emitter->nesting_depth + -1;
    emitter->item_at_depth = true;
    if (eVar5 != emitter_output_json_compact) {
      emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
      pcVar9 = anon_var_dwarf_63f1aec + 7;
      if (emitter->output != emitter_output_json) {
        pcVar9 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        do {
          emitter_printf(emitter,"%s",pcVar9);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
    }
    emitter_printf(emitter,"}");
  }
  else if (eVar5 == emitter_output_table) {
    emitter->nesting_depth = emitter->nesting_depth + -1;
    emitter->item_at_depth = true;
  }
  emitter_dict_begin(emitter,"opt","Run-time option settings");
  iVar4 = duckdb_je_mallctl("opt.malloc_conf.global_var",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 != 0) {
    cpv = anon_var_dwarf_63f17de + 9;
  }
  emitter_kv_note(emitter,"global_var","Global variable malloc_conf",emitter_type_string,&cpv,
                  (char *)0x0,emitter_type_bool,(void *)0x0);
  iVar4 = duckdb_je_mallctl("opt.malloc_conf.symlink",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 != 0) {
    cpv = anon_var_dwarf_63f17de + 9;
  }
  emitter_kv_note(emitter,"symlink","Symbolic link malloc.conf",emitter_type_string,&cpv,(char *)0x0
                  ,emitter_type_bool,(void *)0x0);
  iVar4 = duckdb_je_mallctl("opt.malloc_conf.env_var",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 != 0) {
    cpv = anon_var_dwarf_63f17de + 9;
  }
  emitter_kv_note(emitter,"env_var","Environment variable MALLOC_CONF",emitter_type_string,&cpv,
                  (char *)0x0,emitter_type_bool,(void *)0x0);
  iVar4 = duckdb_je_mallctl("opt.malloc_conf.global_var_2_conf_harder",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"global_var_2_conf_harder","Global variable malloc_conf_2_conf_harder",
                    emitter_type_string,&cpv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.abort",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"abort","opt.abort",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                    (void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.abort_conf",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"abort_conf","opt.abort_conf",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.cache_oblivious",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"cache_oblivious","opt.cache_oblivious",emitter_type_bool,&bv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.confirm_conf",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"confirm_conf","opt.confirm_conf",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.retain",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"retain","opt.retain",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.dss",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"dss","opt.dss",emitter_type_string,&cpv,(char *)0x0,emitter_type_bool,
                    (void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.narenas",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"narenas","opt.narenas",emitter_type_unsigned,&uv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.percpu_arena",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"percpu_arena","opt.percpu_arena",emitter_type_string,&cpv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.oversize_threshold",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"oversize_threshold","opt.oversize_threshold",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa","opt.hpa",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                    (void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_slab_max_alloc",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_slab_max_alloc","opt.hpa_slab_max_alloc",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_hugification_threshold",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_hugification_threshold","opt.hpa_hugification_threshold",
                    emitter_type_size,&sv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_hugify_delay_ms",&u64v,&u64sz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_hugify_delay_ms","opt.hpa_hugify_delay_ms",emitter_type_uint64,
                    &u64v,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_min_purge_interval_ms",&u64v,&u64sz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_min_purge_interval_ms","opt.hpa_min_purge_interval_ms",
                    emitter_type_uint64,&u64v,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_strict_min_purge_interval",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_strict_min_purge_interval","opt.hpa_strict_min_purge_interval",
                    emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_dirty_mult",&u32v,&u32sz,(void *)0x0,0);
  if (iVar4 == 0) {
    if (u32v == 0xffffffff) {
      value = &sz;
      sz = (long)
           "* Set the sample size to a larger value to enable the auto-detection to scan more values, e.g. sample_size=-1"
           + 0x6b;
    }
    else {
      duckdb_je_fxp_print(u32v,(char *)&sz);
      value = (size_t *)&i64v;
      i64v = (int64_t)&sz;
    }
    emitter_kv_note(emitter,"hpa_dirty_mult","opt.hpa_dirty_mult",emitter_type_string,value,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_sec_nshards",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_sec_nshards","opt.hpa_sec_nshards",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_sec_max_alloc",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_sec_max_alloc","opt.hpa_sec_max_alloc",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_sec_max_bytes",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_sec_max_bytes","opt.hpa_sec_max_bytes",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_sec_bytes_after_flush",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_sec_bytes_after_flush","opt.hpa_sec_bytes_after_flush",
                    emitter_type_size,&sv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.hpa_sec_batch_fill_extra",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"hpa_sec_batch_fill_extra","opt.hpa_sec_batch_fill_extra",
                    emitter_type_size,&sv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.metadata_thp",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"metadata_thp","opt.metadata_thp",emitter_type_string,&cpv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.mutex_max_spin",&i64v,&i64sz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"mutex_max_spin","opt.mutex_max_spin",emitter_type_int64,&i64v,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.background_thread",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    iVar4 = duckdb_je_mallctl("background_thread",&bv2,&bsz,(void *)0x0,0);
    if (iVar4 == 0) {
      emitter_kv_note(emitter,"background_thread","opt.background_thread",emitter_type_bool,&bv,
                      "background_thread",emitter_type_bool,&bv2);
    }
  }
  iVar4 = duckdb_je_mallctl("opt.dirty_decay_ms",&ssv,&sssz,(void *)0x0,0);
  if (iVar4 == 0) {
    iVar4 = duckdb_je_mallctl("arenas.dirty_decay_ms",&ssv2,&sssz,(void *)0x0,0);
    if (iVar4 == 0) {
      emitter_kv_note(emitter,"dirty_decay_ms","opt.dirty_decay_ms",emitter_type_ssize,&ssv,
                      "arenas.dirty_decay_ms",emitter_type_ssize,&ssv2);
    }
  }
  iVar4 = duckdb_je_mallctl("opt.muzzy_decay_ms",&ssv,&sssz,(void *)0x0,0);
  if (iVar4 == 0) {
    iVar4 = duckdb_je_mallctl("arenas.muzzy_decay_ms",&ssv2,&sssz,(void *)0x0,0);
    if (iVar4 == 0) {
      emitter_kv_note(emitter,"muzzy_decay_ms","opt.muzzy_decay_ms",emitter_type_ssize,&ssv,
                      "arenas.muzzy_decay_ms",emitter_type_ssize,&ssv2);
    }
  }
  iVar4 = duckdb_je_mallctl("opt.lg_extent_max_active_fit",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"lg_extent_max_active_fit","opt.lg_extent_max_active_fit",
                    emitter_type_size,&sv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.junk",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"junk","opt.junk",emitter_type_string,&cpv,(char *)0x0,emitter_type_bool
                    ,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.zero",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"zero","opt.zero",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                    (void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.utrace",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"utrace","opt.utrace",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.xmalloc",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"xmalloc","opt.xmalloc",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.experimental_infallible_new",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"experimental_infallible_new","opt.experimental_infallible_new",
                    emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.max_batched_size",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"max_batched_size","opt.max_batched_size",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.remote_free_max",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"remote_free_max","opt.remote_free_max",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.remote_free_max_batch",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"remote_free_max_batch","opt.remote_free_max_batch",emitter_type_size,
                    &sv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.tcache",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache","opt.tcache",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.tcache_max",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache_max","opt.tcache_max",emitter_type_size,&sv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.tcache_nslots_small_min",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache_nslots_small_min","opt.tcache_nslots_small_min",
                    emitter_type_unsigned,&uv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.tcache_nslots_small_max",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache_nslots_small_max","opt.tcache_nslots_small_max",
                    emitter_type_unsigned,&uv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.tcache_nslots_large",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache_nslots_large","opt.tcache_nslots_large",emitter_type_unsigned,
                    &uv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.lg_tcache_nslots_mul",&ssv,&sssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"lg_tcache_nslots_mul","opt.lg_tcache_nslots_mul",emitter_type_ssize,
                    &ssv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.tcache_gc_incr_bytes",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache_gc_incr_bytes","opt.tcache_gc_incr_bytes",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.tcache_gc_delay_bytes",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache_gc_delay_bytes","opt.tcache_gc_delay_bytes",emitter_type_size,
                    &sv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.lg_tcache_flush_small_div",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"lg_tcache_flush_small_div","opt.lg_tcache_flush_small_div",
                    emitter_type_unsigned,&uv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.lg_tcache_flush_large_div",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"lg_tcache_flush_large_div","opt.lg_tcache_flush_large_div",
                    emitter_type_unsigned,&uv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.debug_double_free_max_scan",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"debug_double_free_max_scan","opt.debug_double_free_max_scan",
                    emitter_type_unsigned,&uv,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.thp",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"thp","opt.thp",emitter_type_string,&cpv,(char *)0x0,emitter_type_bool,
                    (void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof","opt.prof",emitter_type_bool,&bv,(char *)0x0,emitter_type_bool,
                    (void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof_bt_max",&uv,&usz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof_bt_max","opt.prof_bt_max",emitter_type_unsigned,&uv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof_prefix",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof_prefix","opt.prof_prefix",emitter_type_string,&cpv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof_active",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    iVar4 = duckdb_je_mallctl("prof.active",&bv2,&bsz,(void *)0x0,0);
    if (iVar4 == 0) {
      emitter_kv_note(emitter,"prof_active","opt.prof_active",emitter_type_bool,&bv,"prof.active",
                      emitter_type_bool,&bv2);
    }
  }
  iVar4 = duckdb_je_mallctl("opt.prof_thread_active_init",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    iVar4 = duckdb_je_mallctl("prof.thread_active_init",&bv2,&bsz,(void *)0x0,0);
    if (iVar4 == 0) {
      emitter_kv_note(emitter,"prof_thread_active_init","opt.prof_thread_active_init",
                      emitter_type_bool,&bv,"prof.thread_active_init",emitter_type_bool,&bv2);
    }
  }
  iVar4 = duckdb_je_mallctl("opt.lg_prof_sample",&ssv,&sssz,(void *)0x0,0);
  if (iVar4 == 0) {
    iVar4 = duckdb_je_mallctl("prof.lg_sample",&ssv2,&sssz,(void *)0x0,0);
    if (iVar4 == 0) {
      emitter_kv_note(emitter,"lg_prof_sample","opt.lg_prof_sample",emitter_type_ssize,&ssv,
                      "prof.lg_sample",emitter_type_ssize,&ssv2);
    }
  }
  iVar4 = duckdb_je_mallctl("opt.prof_accum",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof_accum","opt.prof_accum",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.lg_prof_interval",&ssv,&sssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"lg_prof_interval","opt.lg_prof_interval",emitter_type_ssize,&ssv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof_gdump",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof_gdump","opt.prof_gdump",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof_final",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof_final","opt.prof_final",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof_leak",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof_leak","opt.prof_leak",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.prof_leak_error",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"prof_leak_error","opt.prof_leak_error",emitter_type_bool,&bv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.stats_print",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"stats_print","opt.stats_print",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.stats_print_opts",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"stats_print_opts","opt.stats_print_opts",emitter_type_string,&cpv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.stats_print",&bv,&bsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"stats_print","opt.stats_print",emitter_type_bool,&bv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.stats_print_opts",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"stats_print_opts","opt.stats_print_opts",emitter_type_string,&cpv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.stats_interval",&i64v,&i64sz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"stats_interval","opt.stats_interval",emitter_type_int64,&i64v,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.stats_interval_opts",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"stats_interval_opts","opt.stats_interval_opts",emitter_type_string,&cpv
                    ,(char *)0x0,emitter_type_bool,(void *)0x0);
  }
  iVar4 = duckdb_je_mallctl("opt.zero_realloc",&cpv,&cpsz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"zero_realloc","opt.zero_realloc",emitter_type_string,&cpv,(char *)0x0,
                    emitter_type_bool,(void *)0x0);
  }
  eVar5 = emitter->output;
  if (eVar5 < emitter_output_table) {
    emitter->nesting_depth = emitter->nesting_depth + -1;
    emitter->item_at_depth = true;
    if (eVar5 != emitter_output_json_compact) {
      emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
      pcVar9 = anon_var_dwarf_63f1aec + 7;
      if (emitter->output != emitter_output_json) {
        pcVar9 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        do {
          emitter_printf(emitter,"%s",pcVar9);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
    }
    emitter_printf(emitter,"}");
  }
  else if (eVar5 == emitter_output_table) {
    emitter->nesting_depth = emitter->nesting_depth + -1;
    emitter->item_at_depth = true;
  }
  emitter_json_object_kv_begin(emitter,"arenas");
  sz = 4;
  iVar4 = duckdb_je_mallctl("arenas.narenas",&uv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.narenas";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"narenas","Arenas",emitter_type_unsigned,&uv,(char *)0x0,emitter_type_bool
                  ,(void *)0x0);
  sz = 8;
  iVar4 = duckdb_je_mallctl("arenas.dirty_decay_ms",&ssv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.dirty_decay_ms";
    goto LAB_001f33f9;
  }
  emitter_json_kv(emitter,"dirty_decay_ms",emitter_type_ssize,&ssv);
  sz = 8;
  iVar4 = duckdb_je_mallctl("arenas.muzzy_decay_ms",&ssv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.muzzy_decay_ms";
    goto LAB_001f33f9;
  }
  emitter_json_kv(emitter,"muzzy_decay_ms",emitter_type_ssize,&ssv);
  sz = 8;
  iVar4 = duckdb_je_mallctl("arenas.quantum",&sv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.quantum";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"quantum","Quantum size",emitter_type_size,&sv,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  sz = 8;
  iVar4 = duckdb_je_mallctl("arenas.page",&sv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.page";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"page","Page size",emitter_type_size,&sv,(char *)0x0,emitter_type_bool,
                  (void *)0x0);
  sz = 8;
  iVar4 = duckdb_je_mallctl("arenas.hugepage",&sv,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.hugepage";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"hugepage","Hugepage size",emitter_type_size,&sv,(char *)0x0,
                  emitter_type_bool,(void *)0x0);
  iVar4 = duckdb_je_mallctl("arenas.tcache_max",&sv,&ssz,(void *)0x0,0);
  if (iVar4 == 0) {
    emitter_kv_note(emitter,"tcache_max","Maximum thread-cached size class",emitter_type_size,&sv,
                    (char *)0x0,emitter_type_bool,(void *)0x0);
  }
  sz = 4;
  iVar4 = duckdb_je_mallctl("arenas.nbins",&arenas_nbins,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.nbins";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"nbins","Number of bin size classes",emitter_type_unsigned,&arenas_nbins,
                  (char *)0x0,emitter_type_bool,(void *)0x0);
  sz = 4;
  iVar4 = duckdb_je_mallctl("arenas.nhbins",&arenas_nhbins,&sz,(void *)0x0,0);
  if (iVar4 != 0) {
    pcVar9 = "arenas.nhbins";
    goto LAB_001f33f9;
  }
  emitter_kv_note(emitter,"nhbins","Number of thread-cache bin size classes",emitter_type_unsigned,
                  &arenas_nhbins,(char *)0x0,emitter_type_bool,(void *)0x0);
  if (emitter->output < emitter_output_table) {
    emitter_json_array_kv_begin(emitter,"bin");
    miblen_new = 7;
    lVar2 = *in_FS_OFFSET;
    ptVar1 = (tsd_t *)(lVar2 + -0x2a90);
    ptVar7 = ptVar1;
    if (*(char *)(lVar2 + -0x2758) != '\0') {
      ptVar7 = duckdb_je_tsd_fetch_slow(ptVar1,false);
    }
    local_c8 = emitter;
    iVar4 = duckdb_je_ctl_mibnametomib(ptVar7,&sz,0,"arenas.bin",&miblen_new);
    if (iVar4 == 0) {
      if (arenas_nbins != 0) {
        uVar8 = 0;
        do {
          peVar3 = local_c8;
          eVar5 = local_c8->output;
          local_98 = uVar8;
          local_40 = uVar8;
          if (eVar5 < emitter_output_table) {
            if (local_c8->emitted_key == true) {
              local_c8->emitted_key = false;
            }
            else {
              if (local_c8->item_at_depth == true) {
                emitter_printf(local_c8,",");
                eVar5 = peVar3->output;
              }
              if (eVar5 != emitter_output_json_compact) {
                emitter_printf(peVar3,anon_var_dwarf_63f1717 + 8);
                pcVar9 = anon_var_dwarf_63f1aec + 7;
                if (peVar3->output != emitter_output_json) {
                  pcVar9 = " ";
                }
                if (0 < peVar3->nesting_depth) {
                  iVar4 = peVar3->nesting_depth << (peVar3->output != emitter_output_json);
                  if (iVar4 < 2) {
                    iVar4 = 1;
                  }
                  do {
                    emitter_printf(peVar3,"%s",pcVar9);
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                }
              }
            }
            emitter_printf(peVar3,"{");
            peVar3->nesting_depth = peVar3->nesting_depth + 1;
            peVar3->item_at_depth = false;
          }
          miblen_new = 7;
          sz_20 = 8;
          ptVar7 = ptVar1;
          if (*(char *)(lVar2 + -0x2758) != '\0') {
            ptVar7 = duckdb_je_tsd_fetch_slow(ptVar1,false);
          }
          iVar4 = duckdb_je_ctl_bymibname(ptVar7,&sz,3,"size",&miblen_new,&sv,&sz_20,(void *)0x0,0);
          if (iVar4 != 0) goto LAB_001f3267;
          emitter_json_kv(local_c8,"size",emitter_type_size,&sv);
          miblen_new = 7;
          sz_20 = 4;
          ptVar7 = ptVar1;
          if (*(char *)(lVar2 + -0x2758) != '\0') {
            ptVar7 = duckdb_je_tsd_fetch_slow(ptVar1,false);
          }
          iVar4 = duckdb_je_ctl_bymibname
                            (ptVar7,&sz,3,"nregs",&miblen_new,&u32v,&sz_20,(void *)0x0,0);
          if (iVar4 != 0) goto LAB_001f3267;
          emitter_json_kv(local_c8,"nregs",emitter_type_uint32,&u32v);
          miblen_new = 7;
          sz_20 = 8;
          ptVar7 = ptVar1;
          if (*(char *)(lVar2 + -0x2758) != '\0') {
            ptVar7 = duckdb_je_tsd_fetch_slow(ptVar1,false);
          }
          iVar4 = duckdb_je_ctl_bymibname
                            (ptVar7,&sz,3,"slab_size",&miblen_new,&sv,&sz_20,(void *)0x0,0);
          if (iVar4 != 0) goto LAB_001f3267;
          emitter_json_kv(local_c8,"slab_size",emitter_type_size,&sv);
          miblen_new = 7;
          sz_20 = 4;
          ptVar7 = ptVar1;
          if (*(char *)(lVar2 + -0x2758) != '\0') {
            ptVar7 = duckdb_je_tsd_fetch_slow(ptVar1,false);
          }
          iVar4 = duckdb_je_ctl_bymibname
                            (ptVar7,&sz,3,"nshards",&miblen_new,&u32v,&sz_20,(void *)0x0,0);
          peVar3 = local_c8;
          if (iVar4 != 0) goto LAB_001f3267;
          emitter_json_kv(local_c8,"nshards",emitter_type_uint32,&u32v);
          if (peVar3->output < emitter_output_table) {
            peVar3->nesting_depth = peVar3->nesting_depth + -1;
            peVar3->item_at_depth = true;
            if (peVar3->output != emitter_output_json_compact) {
              emitter_printf(peVar3,anon_var_dwarf_63f1717 + 8);
              pcVar9 = anon_var_dwarf_63f1aec + 7;
              if (peVar3->output != emitter_output_json) {
                pcVar9 = " ";
              }
              if (0 < peVar3->nesting_depth) {
                iVar4 = peVar3->nesting_depth << (peVar3->output != emitter_output_json);
                if (iVar4 < 2) {
                  iVar4 = 1;
                }
                do {
                  emitter_printf(peVar3,"%s",pcVar9);
                  iVar4 = iVar4 + -1;
                } while (iVar4 != 0);
              }
            }
            emitter_printf(peVar3,"}");
          }
          uVar8 = local_40 + 1;
        } while (uVar8 < arenas_nbins);
      }
      emitter = local_c8;
      if (local_c8->output < emitter_output_table) {
        local_c8->nesting_depth = local_c8->nesting_depth + -1;
        local_c8->item_at_depth = true;
        if (local_c8->output != emitter_output_json_compact) {
          emitter_printf(local_c8,anon_var_dwarf_63f1717 + 8);
          pcVar9 = anon_var_dwarf_63f1aec + 7;
          if (emitter->output != emitter_output_json) {
            pcVar9 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            if (iVar4 < 2) {
              iVar4 = 1;
            }
            do {
              emitter_printf(emitter,"%s",pcVar9);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
        }
        emitter_printf(emitter,"]");
      }
      goto LAB_001f2e76;
    }
  }
  else {
LAB_001f2e76:
    sz = 4;
    iVar4 = duckdb_je_mallctl("arenas.nlextents",&nlextents,&sz,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar9 = "arenas.nlextents";
LAB_001f33f9:
      duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n",pcVar9);
      abort();
    }
    emitter_kv_note(emitter,"nlextents","Number of large size classes",emitter_type_unsigned,
                    &nlextents,(char *)0x0,emitter_type_bool,(void *)0x0);
    if (emitter_output_json_compact < emitter->output) {
      return;
    }
    emitter_json_array_kv_begin(emitter,"lextent");
    miblen_new = 7;
    lVar2 = *in_FS_OFFSET;
    ptVar1 = (tsd_t *)(lVar2 + -0x2a90);
    ptVar7 = ptVar1;
    if (*(char *)(lVar2 + -0x2758) != '\0') {
      ptVar7 = duckdb_je_tsd_fetch_slow(ptVar1,false);
    }
    iVar4 = duckdb_je_ctl_mibnametomib(ptVar7,&sz,0,"arenas.lextent",&miblen_new);
    if (iVar4 == 0) {
      if (nlextents != 0) {
        uVar8 = 0;
        do {
          eVar5 = emitter->output;
          local_98 = uVar8;
          if (eVar5 < emitter_output_table) {
            if (emitter->emitted_key == true) {
              emitter->emitted_key = false;
            }
            else {
              if (emitter->item_at_depth == true) {
                emitter_printf(emitter,",");
                eVar5 = emitter->output;
              }
              if (eVar5 != emitter_output_json_compact) {
                emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
                pcVar9 = anon_var_dwarf_63f1aec + 7;
                if (emitter->output != emitter_output_json) {
                  pcVar9 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  if (iVar4 < 2) {
                    iVar4 = 1;
                  }
                  do {
                    emitter_printf(emitter,"%s",pcVar9);
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                }
              }
            }
            emitter_printf(emitter,"{");
            emitter->nesting_depth = emitter->nesting_depth + 1;
            emitter->item_at_depth = false;
          }
          miblen_new = 7;
          sz_20 = 8;
          ptVar7 = ptVar1;
          if (*(char *)(lVar2 + -0x2758) != '\0') {
            ptVar7 = duckdb_je_tsd_fetch_slow(ptVar1,false);
          }
          iVar4 = duckdb_je_ctl_bymibname(ptVar7,&sz,3,"size",&miblen_new,&sv,&sz_20,(void *)0x0,0);
          if (iVar4 != 0) goto LAB_001f3267;
          emitter_json_kv(emitter,"size",emitter_type_size,&sv);
          if (emitter->output < emitter_output_table) {
            emitter->nesting_depth = emitter->nesting_depth + -1;
            emitter->item_at_depth = true;
            if (emitter->output != emitter_output_json_compact) {
              emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
              pcVar9 = anon_var_dwarf_63f1aec + 7;
              if (emitter->output != emitter_output_json) {
                pcVar9 = " ";
              }
              if (0 < emitter->nesting_depth) {
                iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                if (iVar4 < 2) {
                  iVar4 = 1;
                }
                do {
                  emitter_printf(emitter,"%s",pcVar9);
                  iVar4 = iVar4 + -1;
                } while (iVar4 != 0);
              }
            }
            emitter_printf(emitter,"}");
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < nlextents);
      }
      if (emitter_output_json_compact < emitter->output) {
        return;
      }
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      if (emitter->output != emitter_output_json_compact) {
        emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
        pcVar9 = anon_var_dwarf_63f1aec + 7;
        if (emitter->output != emitter_output_json) {
          pcVar9 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar4 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          do {
            emitter_printf(emitter,"%s",pcVar9);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      emitter_printf(emitter,"]");
      if (emitter_output_json_compact < emitter->output) {
        return;
      }
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      if (emitter->output != emitter_output_json_compact) {
        emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
        pcVar9 = anon_var_dwarf_63f1aec + 7;
        if (emitter->output != emitter_output_json) {
          pcVar9 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar6 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar4 = 1;
          if (1 < iVar6) {
            iVar4 = iVar6;
          }
          do {
            emitter_printf(emitter,"%s",pcVar9);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      emitter_printf(emitter,"}");
      return;
    }
  }
  pcVar9 = "<jemalloc>: Failure in ctl_mibnametomib()\n";
LAB_001f326e:
  duckdb_je_malloc_write(pcVar9);
  abort();
LAB_001f3267:
  pcVar9 = "<jemalloc>: Failure in ctl_bymibname()\n";
  goto LAB_001f326e;
}

Assistant:

JEMALLOC_COLD
static void
stats_general_print(emitter_t *emitter) {
	const char *cpv;
	bool bv, bv2;
	unsigned uv;
	uint32_t u32v;
	uint64_t u64v;
	int64_t i64v;
	ssize_t ssv, ssv2;
	size_t sv, bsz, usz, u32sz, u64sz, i64sz, ssz, sssz, cpsz;

	bsz = sizeof(bool);
	usz = sizeof(unsigned);
	ssz = sizeof(size_t);
	sssz = sizeof(ssize_t);
	cpsz = sizeof(const char *);
	u32sz = sizeof(uint32_t);
	i64sz = sizeof(int64_t);
	u64sz = sizeof(uint64_t);

	CTL_GET("version", &cpv, const char *);
	emitter_kv(emitter, "version", "Version", emitter_type_string, &cpv);

	/* config. */
	emitter_dict_begin(emitter, "config", "Build-time option settings");
#define CONFIG_WRITE_BOOL(name)						\
	do {								\
		CTL_GET("config."#name, &bv, bool);			\
		emitter_kv(emitter, #name, "config."#name,		\
		    emitter_type_bool, &bv);				\
	} while (0)

	CONFIG_WRITE_BOOL(cache_oblivious);
	CONFIG_WRITE_BOOL(debug);
	CONFIG_WRITE_BOOL(fill);
	CONFIG_WRITE_BOOL(lazy_lock);
	emitter_kv(emitter, "malloc_conf", "config.malloc_conf",
	    emitter_type_string, &config_malloc_conf);

	CONFIG_WRITE_BOOL(opt_safety_checks);
	CONFIG_WRITE_BOOL(prof);
	CONFIG_WRITE_BOOL(prof_libgcc);
	CONFIG_WRITE_BOOL(prof_libunwind);
	CONFIG_WRITE_BOOL(stats);
	CONFIG_WRITE_BOOL(utrace);
	CONFIG_WRITE_BOOL(xmalloc);
#undef CONFIG_WRITE_BOOL
	emitter_dict_end(emitter); /* Close "config" dict. */

	/* opt. */
#define OPT_WRITE(name, var, size, emitter_type)			\
	if (je_mallctl("opt."name, (void *)&var, &size, NULL, 0) ==	\
	    0) {							\
		emitter_kv(emitter, name, "opt."name, emitter_type,	\
		    &var);						\
	}

#define OPT_WRITE_MUTABLE(name, var1, var2, size, emitter_type,		\
    altname)								\
	if (je_mallctl("opt."name, (void *)&var1, &size, NULL, 0) ==	\
	    0 && je_mallctl(altname, (void *)&var2, &size, NULL, 0)	\
	    == 0) {							\
		emitter_kv_note(emitter, name, "opt."name,		\
		    emitter_type, &var1, altname, emitter_type,		\
		    &var2);						\
	}

#define OPT_WRITE_BOOL(name) OPT_WRITE(name, bv, bsz, emitter_type_bool)
#define OPT_WRITE_BOOL_MUTABLE(name, altname)				\
	OPT_WRITE_MUTABLE(name, bv, bv2, bsz, emitter_type_bool, altname)

#define OPT_WRITE_UNSIGNED(name)					\
	OPT_WRITE(name, uv, usz, emitter_type_unsigned)

#define OPT_WRITE_INT64(name)						\
	OPT_WRITE(name, i64v, i64sz, emitter_type_int64)
#define OPT_WRITE_UINT64(name)						\
	OPT_WRITE(name, u64v, u64sz, emitter_type_uint64)

#define OPT_WRITE_SIZE_T(name)						\
	OPT_WRITE(name, sv, ssz, emitter_type_size)
#define OPT_WRITE_SSIZE_T(name)						\
	OPT_WRITE(name, ssv, sssz, emitter_type_ssize)
#define OPT_WRITE_SSIZE_T_MUTABLE(name, altname)			\
	OPT_WRITE_MUTABLE(name, ssv, ssv2, sssz, emitter_type_ssize,	\
	    altname)

#define OPT_WRITE_CHAR_P(name)						\
	OPT_WRITE(name, cpv, cpsz, emitter_type_string)

	emitter_dict_begin(emitter, "opt", "Run-time option settings");

	/*
	 * opt.malloc_conf.
	 *
	 * Sources are documented in https://jemalloc.net/jemalloc.3.html#tuning
	 * - (Not Included Here) The string specified via --with-malloc-conf,
	 *     which is already printed out above as config.malloc_conf
	 * - (Included) The string pointed to by the global variable malloc_conf
	 * - (Included) The “name” of the file referenced by the symbolic link
	 *     named /etc/malloc.conf
	 * - (Included) The value of the environment variable MALLOC_CONF
	 * - (Optional, Unofficial) The string pointed to by the global variable
	 *     malloc_conf_2_conf_harder, which is hidden from the public.
	 *
	 * Note: The outputs are strictly ordered by priorities (low -> high).
	 *
	 */
#define MALLOC_CONF_WRITE(name, message)					\
	if (je_mallctl("opt.malloc_conf."name, (void *)&cpv, &cpsz, NULL, 0) !=	\
	    0) {								\
		cpv = "";							\
	}									\
	emitter_kv(emitter, name, message, emitter_type_string,	&cpv);

	MALLOC_CONF_WRITE("global_var", "Global variable malloc_conf");
	MALLOC_CONF_WRITE("symlink", "Symbolic link malloc.conf");
	MALLOC_CONF_WRITE("env_var", "Environment variable MALLOC_CONF");
	/* As this config is unofficial, skip the output if it's NULL */
	if (je_mallctl("opt.malloc_conf.global_var_2_conf_harder",
	    (void *)&cpv, &cpsz, NULL, 0) == 0) {
		emitter_kv(emitter, "global_var_2_conf_harder", "Global "
		    "variable malloc_conf_2_conf_harder", emitter_type_string, &cpv);
	}
#undef MALLOC_CONF_WRITE

	OPT_WRITE_BOOL("abort")
	OPT_WRITE_BOOL("abort_conf")
	OPT_WRITE_BOOL("cache_oblivious")
	OPT_WRITE_BOOL("confirm_conf")
	OPT_WRITE_BOOL("retain")
	OPT_WRITE_CHAR_P("dss")
	OPT_WRITE_UNSIGNED("narenas")
	OPT_WRITE_CHAR_P("percpu_arena")
	OPT_WRITE_SIZE_T("oversize_threshold")
	OPT_WRITE_BOOL("hpa")
	OPT_WRITE_SIZE_T("hpa_slab_max_alloc")
	OPT_WRITE_SIZE_T("hpa_hugification_threshold")
	OPT_WRITE_UINT64("hpa_hugify_delay_ms")
	OPT_WRITE_UINT64("hpa_min_purge_interval_ms")
	OPT_WRITE_BOOL("hpa_strict_min_purge_interval")
	if (je_mallctl("opt.hpa_dirty_mult", (void *)&u32v, &u32sz, NULL, 0)
	    == 0) {
		/*
		 * We cheat a little and "know" the secret meaning of this
		 * representation.
		 */
		if (u32v == (uint32_t)-1) {
			const char *neg1 = "-1";
			emitter_kv(emitter, "hpa_dirty_mult",
			    "opt.hpa_dirty_mult", emitter_type_string, &neg1);
		} else {
			char buf[FXP_BUF_SIZE];
			fxp_print(u32v, buf);
			const char *bufp = buf;
			emitter_kv(emitter, "hpa_dirty_mult",
			    "opt.hpa_dirty_mult", emitter_type_string, &bufp);
		}
	}
	OPT_WRITE_SIZE_T("hpa_sec_nshards")
	OPT_WRITE_SIZE_T("hpa_sec_max_alloc")
	OPT_WRITE_SIZE_T("hpa_sec_max_bytes")
	OPT_WRITE_SIZE_T("hpa_sec_bytes_after_flush")
	OPT_WRITE_SIZE_T("hpa_sec_batch_fill_extra")
	OPT_WRITE_CHAR_P("metadata_thp")
	OPT_WRITE_INT64("mutex_max_spin")
	OPT_WRITE_BOOL_MUTABLE("background_thread", "background_thread")
	OPT_WRITE_SSIZE_T_MUTABLE("dirty_decay_ms", "arenas.dirty_decay_ms")
	OPT_WRITE_SSIZE_T_MUTABLE("muzzy_decay_ms", "arenas.muzzy_decay_ms")
	OPT_WRITE_SIZE_T("lg_extent_max_active_fit")
	OPT_WRITE_CHAR_P("junk")
	OPT_WRITE_BOOL("zero")
	OPT_WRITE_BOOL("utrace")
	OPT_WRITE_BOOL("xmalloc")
	OPT_WRITE_BOOL("experimental_infallible_new")
	OPT_WRITE_SIZE_T("max_batched_size")
	OPT_WRITE_SIZE_T("remote_free_max")
	OPT_WRITE_SIZE_T("remote_free_max_batch")
	OPT_WRITE_BOOL("tcache")
	OPT_WRITE_SIZE_T("tcache_max")
	OPT_WRITE_UNSIGNED("tcache_nslots_small_min")
	OPT_WRITE_UNSIGNED("tcache_nslots_small_max")
	OPT_WRITE_UNSIGNED("tcache_nslots_large")
	OPT_WRITE_SSIZE_T("lg_tcache_nslots_mul")
	OPT_WRITE_SIZE_T("tcache_gc_incr_bytes")
	OPT_WRITE_SIZE_T("tcache_gc_delay_bytes")
	OPT_WRITE_UNSIGNED("lg_tcache_flush_small_div")
	OPT_WRITE_UNSIGNED("lg_tcache_flush_large_div")
	OPT_WRITE_UNSIGNED("debug_double_free_max_scan")
	OPT_WRITE_CHAR_P("thp")
	OPT_WRITE_BOOL("prof")
	OPT_WRITE_UNSIGNED("prof_bt_max")
	OPT_WRITE_CHAR_P("prof_prefix")
	OPT_WRITE_BOOL_MUTABLE("prof_active", "prof.active")
	OPT_WRITE_BOOL_MUTABLE("prof_thread_active_init",
	    "prof.thread_active_init")
	OPT_WRITE_SSIZE_T_MUTABLE("lg_prof_sample", "prof.lg_sample")
	OPT_WRITE_BOOL("prof_accum")
	OPT_WRITE_SSIZE_T("lg_prof_interval")
	OPT_WRITE_BOOL("prof_gdump")
	OPT_WRITE_BOOL("prof_final")
	OPT_WRITE_BOOL("prof_leak")
	OPT_WRITE_BOOL("prof_leak_error")
	OPT_WRITE_BOOL("stats_print")
	OPT_WRITE_CHAR_P("stats_print_opts")
	OPT_WRITE_BOOL("stats_print")
	OPT_WRITE_CHAR_P("stats_print_opts")
	OPT_WRITE_INT64("stats_interval")
	OPT_WRITE_CHAR_P("stats_interval_opts")
	OPT_WRITE_CHAR_P("zero_realloc")

	emitter_dict_end(emitter); /* Close "opt". */

#undef OPT_WRITE
#undef OPT_WRITE_MUTABLE
#undef OPT_WRITE_BOOL
#undef OPT_WRITE_BOOL_MUTABLE
#undef OPT_WRITE_UNSIGNED
#undef OPT_WRITE_SSIZE_T
#undef OPT_WRITE_SSIZE_T_MUTABLE
#undef OPT_WRITE_CHAR_P

	/* prof. */
	if (config_prof) {
		emitter_dict_begin(emitter, "prof", "Profiling settings");

		CTL_GET("prof.thread_active_init", &bv, bool);
		emitter_kv(emitter, "thread_active_init",
		    "prof.thread_active_init", emitter_type_bool, &bv);

		CTL_GET("prof.active", &bv, bool);
		emitter_kv(emitter, "active", "prof.active", emitter_type_bool,
		    &bv);

		CTL_GET("prof.gdump", &bv, bool);
		emitter_kv(emitter, "gdump", "prof.gdump", emitter_type_bool,
		    &bv);

		CTL_GET("prof.interval", &u64v, uint64_t);
		emitter_kv(emitter, "interval", "prof.interval",
		    emitter_type_uint64, &u64v);

		CTL_GET("prof.lg_sample", &ssv, ssize_t);
		emitter_kv(emitter, "lg_sample", "prof.lg_sample",
		    emitter_type_ssize, &ssv);

		emitter_dict_end(emitter); /* Close "prof". */
	}

	/* arenas. */
	/*
	 * The json output sticks arena info into an "arenas" dict; the table
	 * output puts them at the top-level.
	 */
	emitter_json_object_kv_begin(emitter, "arenas");

	CTL_GET("arenas.narenas", &uv, unsigned);
	emitter_kv(emitter, "narenas", "Arenas", emitter_type_unsigned, &uv);

	/*
	 * Decay settings are emitted only in json mode; in table mode, they're
	 * emitted as notes with the opt output, above.
	 */
	CTL_GET("arenas.dirty_decay_ms", &ssv, ssize_t);
	emitter_json_kv(emitter, "dirty_decay_ms", emitter_type_ssize, &ssv);

	CTL_GET("arenas.muzzy_decay_ms", &ssv, ssize_t);
	emitter_json_kv(emitter, "muzzy_decay_ms", emitter_type_ssize, &ssv);

	CTL_GET("arenas.quantum", &sv, size_t);
	emitter_kv(emitter, "quantum", "Quantum size", emitter_type_size, &sv);

	CTL_GET("arenas.page", &sv, size_t);
	emitter_kv(emitter, "page", "Page size", emitter_type_size, &sv);

	CTL_GET("arenas.hugepage", &sv, size_t);
	emitter_kv(emitter, "hugepage", "Hugepage size", emitter_type_size,
	    &sv);

	if (je_mallctl("arenas.tcache_max", (void *)&sv, &ssz, NULL, 0) == 0) {
		emitter_kv(emitter, "tcache_max",
		    "Maximum thread-cached size class", emitter_type_size, &sv);
	}

	unsigned arenas_nbins;
	CTL_GET("arenas.nbins", &arenas_nbins, unsigned);
	emitter_kv(emitter, "nbins", "Number of bin size classes",
	    emitter_type_unsigned, &arenas_nbins);

	unsigned arenas_nhbins;
	CTL_GET("arenas.nhbins", &arenas_nhbins, unsigned);
	emitter_kv(emitter, "nhbins", "Number of thread-cache bin size classes",
	    emitter_type_unsigned, &arenas_nhbins);

	/*
	 * We do enough mallctls in a loop that we actually want to omit them
	 * (not just omit the printing).
	 */
	if (emitter_outputs_json(emitter)) {
		emitter_json_array_kv_begin(emitter, "bin");
		size_t arenas_bin_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(arenas_bin_mib, 0, "arenas.bin");
		for (unsigned i = 0; i < arenas_nbins; i++) {
			arenas_bin_mib[2] = i;
			emitter_json_object_begin(emitter);

			CTL_LEAF(arenas_bin_mib, 3, "size", &sv, size_t);
			emitter_json_kv(emitter, "size", emitter_type_size,
			    &sv);

			CTL_LEAF(arenas_bin_mib, 3, "nregs", &u32v, uint32_t);
			emitter_json_kv(emitter, "nregs", emitter_type_uint32,
			    &u32v);

			CTL_LEAF(arenas_bin_mib, 3, "slab_size", &sv, size_t);
			emitter_json_kv(emitter, "slab_size", emitter_type_size,
			    &sv);

			CTL_LEAF(arenas_bin_mib, 3, "nshards", &u32v, uint32_t);
			emitter_json_kv(emitter, "nshards", emitter_type_uint32,
			    &u32v);

			emitter_json_object_end(emitter);
		}
		emitter_json_array_end(emitter); /* Close "bin". */
	}

	unsigned nlextents;
	CTL_GET("arenas.nlextents", &nlextents, unsigned);
	emitter_kv(emitter, "nlextents", "Number of large size classes",
	    emitter_type_unsigned, &nlextents);

	if (emitter_outputs_json(emitter)) {
		emitter_json_array_kv_begin(emitter, "lextent");
		size_t arenas_lextent_mib[CTL_MAX_DEPTH];
		CTL_LEAF_PREPARE(arenas_lextent_mib, 0, "arenas.lextent");
		for (unsigned i = 0; i < nlextents; i++) {
			arenas_lextent_mib[2] = i;
			emitter_json_object_begin(emitter);

			CTL_LEAF(arenas_lextent_mib, 3, "size", &sv, size_t);
			emitter_json_kv(emitter, "size", emitter_type_size,
			    &sv);

			emitter_json_object_end(emitter);
		}
		emitter_json_array_end(emitter); /* Close "lextent". */
	}

	emitter_json_object_end(emitter); /* Close "arenas" */
}